

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer *ppmVar4;
  size_type *psVar5;
  undefined1 printInput;
  undefined1 uVar6;
  bool shouldPrintTokens;
  undefined1 uVar7;
  string local_438;
  string local_418;
  SwitchArg argInput;
  string local_350;
  SwitchArg argAst;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  tables;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Alloc_hider local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  _Alloc_hider local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _Alloc_hider local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [2];
  undefined2 local_1e5;
  vector<Token,_std::allocator<Token>_> local_1d8;
  SwitchArg argTest;
  Lexer lex;
  
  psVar1 = &argInput.super_Arg._flag._M_string_length;
  argInput.super_Arg._vptr_Arg = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argInput,"Toy compiler","");
  ppmVar4 = &tables.
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  tables.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppmVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tables,"0.1","");
  TCLAP::CmdLine::CmdLine((CmdLine *)&lex,(string *)&argInput,' ',(string *)&tables,true);
  if (tables.
      super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppmVar4) {
    operator_delete(tables.
                    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)&((tables.
                              super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t)._M_impl.
                            field_0x1);
  }
  if (argInput.super_Arg._vptr_Arg != (_func_int **)psVar1) {
    operator_delete(argInput.super_Arg._vptr_Arg,argInput.super_Arg._flag._M_string_length + 1);
  }
  tables.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppmVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tables,"i","");
  psVar1 = &argTest.super_Arg._flag._M_string_length;
  argTest.super_Arg._vptr_Arg = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argTest,"debug_input","");
  psVar5 = &argAst.super_Arg._flag._M_string_length;
  argAst.super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argAst,"Print input that was given","")
  ;
  TCLAP::Arg::Arg(&argInput.super_Arg,(string *)&tables,(string *)&argTest,(string *)&argAst,false,
                  false,(Visitor *)0x0);
  argInput.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_001390b8;
  argInput.super_Arg._163_2_ = 0;
  (*(code *)lex.rules.
            super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)();
  if (argAst.super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(argAst.super_Arg._vptr_Arg,argAst.super_Arg._flag._M_string_length + 1);
  }
  if (argTest.super_Arg._vptr_Arg != (_func_int **)psVar1) {
    operator_delete(argTest.super_Arg._vptr_Arg,argTest.super_Arg._flag._M_string_length + 1);
  }
  if (tables.
      super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppmVar4) {
    operator_delete(tables.
                    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)&((tables.
                              super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t)._M_impl.
                            field_0x1);
  }
  argTest.super_Arg._vptr_Arg = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argTest,"l","");
  argAst.super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argAst,"debug_lexer","");
  paVar2 = &local_438.field_2;
  local_438._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Print tokens","");
  TCLAP::Arg::Arg((Arg *)&tables,(string *)&argTest,(string *)&argAst,&local_438,false,false,
                  (Visitor *)0x0);
  tables.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Arg_001390b8;
  local_1e5 = 0;
  (*(code *)lex.rules.
            super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != paVar2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if (argAst.super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(argAst.super_Arg._vptr_Arg,argAst.super_Arg._flag._M_string_length + 1);
  }
  if (argTest.super_Arg._vptr_Arg != (_func_int **)psVar1) {
    operator_delete(argTest.super_Arg._vptr_Arg,argTest.super_Arg._flag._M_string_length + 1);
  }
  argAst.super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argAst,"");
  local_438._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"test","");
  paVar3 = &local_418.field_2;
  local_418._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Run tests","");
  TCLAP::Arg::Arg(&argTest.super_Arg,(string *)&argAst,&local_438,&local_418,false,false,
                  (Visitor *)0x0);
  argTest.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_001390b8;
  argTest.super_Arg._163_2_ = 0;
  (*(code *)lex.rules.
            super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != paVar3) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != paVar2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if (argAst.super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(argAst.super_Arg._vptr_Arg,argAst.super_Arg._flag._M_string_length + 1);
  }
  local_438._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"a","");
  local_418._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"debug_ast","");
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_350,"Print graphviz representation of AST","");
  TCLAP::Arg::Arg(&argAst.super_Arg,&local_438,&local_418,&local_350,false,false,(Visitor *)0x0);
  argAst.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_001390b8;
  argAst.super_Arg._163_2_ = 0;
  (*(code *)lex.rules.
            super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != paVar3) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != paVar2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  TCLAP::CmdLine::parse((CmdLine *)&lex,argc,argv);
  printInput = argInput.super_Arg._163_1_;
  shouldPrintTokens = local_1e5._0_1_;
  uVar7 = argTest.super_Arg._163_1_;
  uVar6 = argAst.super_Arg._163_1_;
  argAst.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00138f30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argAst.super_Arg._requireLabel._M_dataplus._M_p != &argAst.super_Arg._requireLabel.field_2)
  {
    operator_delete(argAst.super_Arg._requireLabel._M_dataplus._M_p,
                    argAst.super_Arg._requireLabel.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argAst.super_Arg._description._M_dataplus._M_p != &argAst.super_Arg._description.field_2) {
    operator_delete(argAst.super_Arg._description._M_dataplus._M_p,
                    argAst.super_Arg._description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argAst.super_Arg._name._M_dataplus._M_p != &argAst.super_Arg._name.field_2) {
    operator_delete(argAst.super_Arg._name._M_dataplus._M_p,
                    argAst.super_Arg._name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argAst.super_Arg._flag._M_dataplus._M_p != &argAst.super_Arg._flag.field_2) {
    operator_delete(argAst.super_Arg._flag._M_dataplus._M_p,
                    argAst.super_Arg._flag.field_2._M_allocated_capacity + 1);
  }
  argTest.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00138f30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argTest.super_Arg._requireLabel._M_dataplus._M_p !=
      &argTest.super_Arg._requireLabel.field_2) {
    operator_delete(argTest.super_Arg._requireLabel._M_dataplus._M_p,
                    argTest.super_Arg._requireLabel.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argTest.super_Arg._description._M_dataplus._M_p != &argTest.super_Arg._description.field_2)
  {
    operator_delete(argTest.super_Arg._description._M_dataplus._M_p,
                    argTest.super_Arg._description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argTest.super_Arg._name._M_dataplus._M_p != &argTest.super_Arg._name.field_2) {
    operator_delete(argTest.super_Arg._name._M_dataplus._M_p,
                    argTest.super_Arg._name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argTest.super_Arg._flag._M_dataplus._M_p != &argTest.super_Arg._flag.field_2) {
    operator_delete(argTest.super_Arg._flag._M_dataplus._M_p,
                    argTest.super_Arg._flag.field_2._M_allocated_capacity + 1);
  }
  tables.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Arg_00138f30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_p != local_208) {
    operator_delete(local_218._M_p,local_208[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_p != &local_230) {
    operator_delete(local_240._M_p,local_230._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_p != &local_250) {
    operator_delete(local_260._M_p,local_250._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tables.
         super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish != &local_270) {
    operator_delete(tables.
                    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,local_270._0_8_ + 1);
  }
  argInput.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00138f30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argInput.super_Arg._requireLabel._M_dataplus._M_p !=
      &argInput.super_Arg._requireLabel.field_2) {
    operator_delete(argInput.super_Arg._requireLabel._M_dataplus._M_p,
                    argInput.super_Arg._requireLabel.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argInput.super_Arg._description._M_dataplus._M_p !=
      &argInput.super_Arg._description.field_2) {
    operator_delete(argInput.super_Arg._description._M_dataplus._M_p,
                    argInput.super_Arg._description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argInput.super_Arg._name._M_dataplus._M_p != &argInput.super_Arg._name.field_2) {
    operator_delete(argInput.super_Arg._name._M_dataplus._M_p,
                    argInput.super_Arg._name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argInput.super_Arg._flag._M_dataplus._M_p != &argInput.super_Arg._flag.field_2) {
    operator_delete(argInput.super_Arg._flag._M_dataplus._M_p,
                    argInput.super_Arg._flag.field_2._M_allocated_capacity + 1);
  }
  TCLAP::CmdLine::~CmdLine((CmdLine *)&lex);
  if (uVar7 == '\0') {
    Lexer::Lexer(&lex);
    psVar1 = &argInput.super_Arg._flag._M_string_length;
    argInput.super_Arg._vptr_Arg = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&argInput,"test.ed","");
    Lexer::scan(&lex,(string *)&argInput,(bool)printInput,shouldPrintTokens);
    if (argInput.super_Arg._vptr_Arg != (_func_int **)psVar1) {
      operator_delete(argInput.super_Arg._vptr_Arg,argInput.super_Arg._flag._M_string_length + 1);
    }
    argInput.super_Arg._flag._M_string_length = 0;
    argInput.super_Arg._flag.field_2._M_allocated_capacity = 0;
    argInput.super_Arg._vptr_Arg = (_func_int **)0x0;
    argInput.super_Arg._flag._M_dataplus._M_p = (pointer)0x0;
    std::vector<Token,_std::allocator<Token>_>::vector(&local_1d8,&lex.tokens);
    Parser::parse((Parser *)&argInput,&local_1d8);
    std::vector<Token,_std::allocator<Token>_>::~vector(&local_1d8);
    tables.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tables.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tables.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(code **)(*argInput.super_Arg._vptr_Arg + 0x28))();
    if (uVar6 != '\0') {
      Parser::print((Parser *)&argInput);
    }
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ::~vector(&tables);
    std::vector<Token,_std::allocator<Token>_>::~vector
              ((vector<Token,_std::allocator<Token>_> *)&argInput.super_Arg._flag);
    if (argInput.super_Arg._vptr_Arg != (_func_int **)0x0) {
      (**(code **)(*argInput.super_Arg._vptr_Arg + 8))();
    }
    std::vector<Token,_std::allocator<Token>_>::~vector(&lex.tokens);
    std::
    vector<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector(&lex.rules);
  }
  else {
    lex.rules.
    super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lex.rules.
    super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lex.rules.
    super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Tester::
    specify<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
              ((Tester *)&lex,"assign.ed","decl.ed","funcargsret.ed","funcargsvoid.ed",
               "funcvoidvoid.ed","if.ed","ifelse.ed","nestedif.ed","functions.ed","struct.ed",
               "inferdecl.ed");
    Tester::runAll((Tester *)&lex);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&lex);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    bool input = false;
    bool test = false;
    bool tokens = false;
    bool ast = false;
    try {
        TCLAP::CmdLine cmd("Toy compiler", ' ', "0.1");

        TCLAP::SwitchArg argInput("i","debug_input","Print input that was given", cmd, false);
        TCLAP::SwitchArg argTokens("l","debug_lexer","Print tokens", cmd, false);
        TCLAP::SwitchArg argTest("","test","Run tests", cmd, false);
        TCLAP::SwitchArg argAst("a","debug_ast","Print graphviz representation of AST", cmd, false);

        // Parse the argv array.
        cmd.parse(argc, argv);

        // Get the value parsed by each arg.
        input = argInput.getValue();
        tokens = argTokens.getValue();
        test = argTest.getValue();
        ast = argAst.getValue();
    } catch (TCLAP::ArgException &e) {
        std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
    }

    // run all tests then quit
    if (test) {
        Tester tester;
        tester.specify("assign.ed",
                       "decl.ed",
                       "funcargsret.ed", "funcargsvoid.ed",
                       "funcvoidvoid.ed", "if.ed",
                       "ifelse.ed", "nestedif.ed",
                       "functions.ed", "struct.ed", "inferdecl.ed"
                       );
        tester.runAll();
        return 0;
    }

    Lexer lex;
    lex.scan("test.ed", input, tokens);

    // syntactic validation
    Parser par;
    try {
        par.parse(lex.tokens);
    }
    catch (const SyntacticException& e) {
        std::cout << e.what();
        return -1;
    }

    // semantic validation
    std::vector<SymbolTable> tables;
    try {
        par.root->check(tables);
    }
    catch (const SemanticException& e) {
        std::cout << e.what();
        return -2;
    }

    if (ast) {
        par.print();
    }
    // std::cout << "table size: " << tables.size() << std::endl;
    // for (auto t : tables) {
    //     for (auto i : t) {
    //         std::cout << "name: " << i.first << std::endl
    //                   << "\tkind: " << i.second.kind << std::endl
    //                   << "\ttype: " << i.second.type << std::endl
    //                   << "\tscope: " << i.second.scope << std::endl;
    //     }
    // }
}